

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

void cp_declarator(CPState *cp,CPDecl *decl)

{
  int iVar1;
  uint uVar2;
  CTSize CVar3;
  CPDeclIdx CVar4;
  CTInfo CVar5;
  bool bVar6;
  
  iVar1 = cp->depth;
  cp->depth = iVar1 + 1;
  if (0x13 < iVar1) {
    cp_err(cp,LJ_ERR_XLEVELS);
  }
  do {
    iVar1 = cp->tok;
    if (iVar1 < 0x2a) {
      if (iVar1 != 0x26) {
        if (iVar1 != 0x28) goto LAB_00153c73;
        cp_next(cp);
        cp_decl_attributes(cp,decl);
        if ((decl->mode & 2) != 0) {
          iVar1 = cp->tok;
          if (iVar1 - 0x10dU < 0x1d || iVar1 == 0x29) goto LAB_00153d68;
          if (iVar1 == 0x24) goto LAB_00153d68;
          if ((iVar1 == 0x100) && ((cp->ct->info & 0xf0000000) == 0x70000000)) goto LAB_00153d68;
        }
        CVar4 = decl->pos;
        cp_declarator(cp,decl);
        cp_check(cp,0x29);
        decl->pos = CVar4;
        goto LAB_00153d53;
      }
LAB_00153b83:
      cp_next(cp);
      decl->attr = decl->attr & 0xfcff00ff;
      CVar5 = 0x22830000;
      CVar3 = 8;
    }
    else {
      if (iVar1 != 0x2a) {
        if (iVar1 == 0x105) goto LAB_00153b83;
        if (iVar1 == 0x100) {
          if ((decl->mode & 4) == 0) {
            cp_err_token(cp,0x103);
          }
          decl->name = cp->str;
          decl->nameid = (cp->val).id;
          cp_next(cp);
        }
        else {
LAB_00153c73:
          if ((decl->mode & 2) == 0) {
            cp_err_token(cp,0x100);
          }
        }
LAB_00153d53:
        while( true ) {
          while (iVar1 = cp->tok, iVar1 == 0x5b) {
            cp_next(cp);
            cp_decl_attributes(cp,decl);
            CVar3 = 0xffffffff;
            CVar5 = 0x30000000;
            if (cp->tok != 0x5d) {
              if (cp->tok == 0x3f) {
                cp_next(cp);
                CVar5 = 0x30100000;
              }
              else {
                CVar3 = cp_expr_ksize(cp);
              }
            }
            cp_check(cp,0x5d);
            cp_add(decl,CVar5,CVar3);
          }
          if (iVar1 != 0x28) break;
          cp_next(cp);
LAB_00153d68:
          cp_decl_func(cp,decl);
        }
        if ((iVar1 == 0x3a) && ((decl->mode & 8) != 0)) {
          cp_next(cp);
          CVar3 = cp_expr_ksize(cp);
          decl->bits = CVar3;
        }
        cp_decl_attributes(cp,decl);
        if ((((decl->stack[decl->pos].info & 0xf0000000) != 0x60000000) && ((decl->attr & 1) != 0))
           && ((decl->mode & 8) == 0)) {
          CVar4 = cp_add(decl,0x80020000,decl->attr >> 0x10 & 0xf);
          decl->pos = CVar4;
        }
        cp->depth = cp->depth + -1;
        return;
      }
      cp_next(cp);
      cp_decl_attributes(cp,decl);
      uVar2 = decl->attr;
      bVar6 = (uVar2 & 0xff00) != 0x400;
      CVar3 = (uint)bVar6 * 4 + 4;
      CVar5 = (uint)bVar6 * 0x10000 + (uVar2 & 0x3800000) + 0x20020000;
      decl->attr = uVar2 & 0xfcff00ff;
    }
    CVar4 = cp_add(decl,CVar5,CVar3);
    decl->pos = CVar4;
  } while( true );
}

Assistant:

static void cp_declarator(CPState *cp, CPDecl *decl)
{
  if (++cp->depth > CPARSE_MAX_DECLDEPTH) cp_err(cp, LJ_ERR_XLEVELS);

  for (;;) {  /* Head of declarator. */
    if (cp_opt(cp, '*')) {  /* Pointer. */
      CTSize sz;
      CTInfo info;
      cp_decl_attributes(cp, decl);
      sz = CTSIZE_PTR;
      info = CTINFO(CT_PTR, CTALIGN_PTR);
#if LJ_64
      if (ctype_msizeP(decl->attr) == 4) {
	sz = 4;
	info = CTINFO(CT_PTR, CTALIGN(2));
      }
#endif
      info += (decl->attr & (CTF_QUAL|CTF_REF));
      decl->attr &= ~(CTF_QUAL|(CTMASK_MSIZEP<<CTSHIFT_MSIZEP));
      cp_push(decl, info, sz);
    } else if (cp_opt(cp, '&') || cp_opt(cp, CTOK_ANDAND)) {  /* Reference. */
      decl->attr &= ~(CTF_QUAL|(CTMASK_MSIZEP<<CTSHIFT_MSIZEP));
      cp_push(decl, CTINFO_REF(0), CTSIZE_PTR);
    } else {
      break;
    }
  }

  if (cp_opt(cp, '(')) {  /* Inner declarator. */
    CPDeclIdx pos;
    cp_decl_attributes(cp, decl);
    /* Resolve ambiguity between inner declarator and 1st function parameter. */
    if ((decl->mode & CPARSE_MODE_ABSTRACT) &&
	(cp->tok == ')' || cp_istypedecl(cp))) goto func_decl;
    pos = decl->pos;
    cp_declarator(cp, decl);
    cp_check(cp, ')');
    decl->pos = pos;
  } else if (cp->tok == CTOK_IDENT) {  /* Direct declarator. */
    if (!(decl->mode & CPARSE_MODE_DIRECT)) cp_err_token(cp, CTOK_EOF);
    decl->name = cp->str;
    decl->nameid = cp->val.id;
    cp_next(cp);
  } else {  /* Abstract declarator. */
    if (!(decl->mode & CPARSE_MODE_ABSTRACT)) cp_err_token(cp, CTOK_IDENT);
  }

  for (;;) {  /* Tail of declarator. */
    if (cp_opt(cp, '[')) {  /* Array. */
      cp_decl_array(cp, decl);
    } else if (cp_opt(cp, '(')) {  /* Function. */
    func_decl:
      cp_decl_func(cp, decl);
    } else {
      break;
    }
  }

  if ((decl->mode & CPARSE_MODE_FIELD) && cp_opt(cp, ':'))  /* Field width. */
    decl->bits = cp_expr_ksize(cp);

  /* Process postfix attributes. */
  cp_decl_attributes(cp, decl);
  cp_push_attributes(decl);

  cp->depth--;
}